

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

shared_ptr<QSslContext> __thiscall QHttpNetworkConnection::sslContext(QHttpNetworkConnection *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<QSslContext> sVar1;
  QHttpNetworkConnectionPrivate *d;
  element_type *this_00;
  
  this_00 = in_RDI;
  d_func((QHttpNetworkConnection *)0x2f0b18);
  std::shared_ptr<QSslContext>::shared_ptr
            ((shared_ptr<QSslContext> *)this_00,(shared_ptr<QSslContext> *)in_RDI);
  sVar1.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (shared_ptr<QSslContext>)sVar1.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QSslContext> QHttpNetworkConnection::sslContext() const
{
    Q_D(const QHttpNetworkConnection);
    return d->sslContext;
}